

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O3

void generate_c_code(ParsedOpcodeInfo *info,CCVariant *var,int m68kop,int synop,SymbolTable *sym,
                    char *operand_decls,char *postcode,OpcodeMappingInfo *map)

{
  char *pcVar1;
  ParsedOpcodeInfo *pPVar2;
  ParsedOpcodeInfo *pPVar3;
  bool bVar4;
  BOOL BVar5;
  List *pLVar6;
  uint uVar7;
  CCVariant *var_00;
  ParsedOpcodeInfo *info_00;
  PatternRange *range;
  long lVar8;
  byte bVar9;
  uint uVar10;
  FILE *pFVar11;
  long lVar12;
  char cVar13;
  bool bVar14;
  int iVar15;
  char *i;
  CCVariant *pCVar16;
  char (*pacVar17) [16];
  char buf1 [6];
  char buf3 [6];
  char buf4 [17];
  BOOL found;
  PatternRange ranges [32];
  char local_2892 [5];
  undefined1 local_288d;
  char local_288c [5];
  undefined1 local_2887;
  char local_2886 [5];
  undefined1 local_2881;
  ParsedOpcodeInfo *local_2880;
  List *local_2878;
  ParsedOpcodeInfo *local_2870;
  CCVariant local_2868;
  BOOL local_283c;
  PatternRange local_2838;
  PatternRange local_2830 [127];
  CCVariant local_2438 [102];
  undefined1 auStack_1438 [5128];
  
  local_2870 = (ParsedOpcodeInfo *)CONCAT44(local_2870._4_4_,synop);
  local_2880 = (ParsedOpcodeInfo *)var;
  local_2878 = (List *)sym;
  local_2868.next = (_CCVariant *)operand_decls;
  pLVar6 = copy_list(var->code);
  c_postamble[0] = '\0';
  c_preamble[0] = '\0';
  iVar15 = 1;
  range = local_2830;
  do {
    BVar5 = pattern_range(info->opcode_bits,iVar15,range);
    pPVar2 = local_2880;
    iVar15 = iVar15 + 1;
    range = range + 1;
  } while (BVar5 != FALSE);
  rde_aux(pLVar6,&local_2838,m68kop,local_2880,(CCVariant *)sym,(int)operand_decls);
  lVar8 = 0;
  local_2878 = reduce(pLVar6,(SymbolTable *)local_2878,0);
  pcVar1 = info->name;
  lVar12 = *(long *)&pPVar2->cpu;
  uVar7 = 0x8000;
  do {
    if (*(char *)(lVar12 + lVar8) == '-') {
      bVar9 = 0x2d;
      if ((info->opcode_bits[lVar8] & 0xfeU) == 0x30) goto LAB_0010c817;
    }
    else {
LAB_0010c817:
      bVar9 = (uVar7 & m68kop) == 0 ^ 0x31;
    }
    (&local_2868.field_0x0)[lVar8] = bVar9;
    lVar8 = lVar8 + 1;
    uVar7 = uVar7 >> 1;
  } while (lVar8 != 0x10);
  local_2868.code._0_1_ = 0;
  uVar7 = *(uint *)&local_2880->name;
  uVar10 = 4;
  lVar12 = 0;
  do {
    if (((uVar7 & 0x1f) >> (uVar10 & 0x1f) & 1) == 0) {
      cVar13 = '-';
    }
    else {
      cVar13 = "-CNVXZ"[lVar12 + 1];
    }
    local_288c[lVar12] = cVar13;
    lVar12 = lVar12 + 1;
    uVar10 = uVar10 - 1;
  } while (lVar12 != 5);
  local_2887 = 0;
  uVar10 = 4;
  lVar12 = 0;
  do {
    if (((uVar7 >> 5 & 0x1f) >> (uVar10 & 0x1f) & 1) == 0) {
      cVar13 = '-';
    }
    else {
      cVar13 = "-CNVXZ"[lVar12 + 1];
    }
    local_2892[lVar12] = cVar13;
    lVar12 = lVar12 + 1;
    uVar10 = uVar10 - 1;
  } while (lVar12 != 5);
  local_288d = 0;
  uVar10 = 4;
  lVar12 = 0;
  do {
    if (((uVar7 >> 10 & 0x1f) >> (uVar10 & 0x1f) & 1) == 0) {
      cVar13 = '-';
    }
    else {
      cVar13 = "-CNVXZ"[lVar12 + 1];
    }
    local_2886[lVar12] = cVar13;
    lVar12 = lVar12 + 1;
    uVar10 = uVar10 - 1;
  } while (lVar12 != 5);
  local_2881 = 0;
  lVar8 = 0;
  fprintf((FILE *)syn68k_c_stream,"\n      /* %s %s ms:%s mns:%s needs:%s */\n",pcVar1,&local_2868,
          local_288c,local_2892,local_2886);
  fprintf((FILE *)syn68k_c_stream,"      CASE (0x%04X)\n",(ulong)local_2870 & 0xffffffff);
  pLVar6 = local_2878;
  pcVar1 = info->name;
  lVar12 = *(long *)&local_2880->cpu;
  uVar7 = 0x8000;
  do {
    if (*(char *)(lVar12 + lVar8) == '-') {
      bVar9 = 0x2d;
      if ((info->opcode_bits[lVar8] & 0xfeU) == 0x30) goto LAB_0010c944;
    }
    else {
LAB_0010c944:
      bVar9 = (uVar7 & m68kop) == 0 ^ 0x31;
    }
    (&local_2868.field_0x0)[lVar8] = bVar9;
    lVar8 = lVar8 + 1;
    uVar7 = uVar7 >> 1;
    if (lVar8 == 0x10) {
      local_2868.code._0_1_ = 0;
      uVar7 = *(uint *)&local_2880->name;
      uVar10 = 4;
      lVar12 = 0;
      do {
        if (((uVar7 & 0x1f) >> (uVar10 & 0x1f) & 1) == 0) {
          cVar13 = '-';
        }
        else {
          cVar13 = "-CNVXZ"[lVar12 + 1];
        }
        local_288c[lVar12] = cVar13;
        lVar12 = lVar12 + 1;
        uVar10 = uVar10 - 1;
      } while (lVar12 != 5);
      local_2887 = 0;
      uVar10 = 4;
      lVar12 = 0;
      do {
        if (((uVar7 >> 5 & 0x1f) >> (uVar10 & 0x1f) & 1) == 0) {
          cVar13 = '-';
        }
        else {
          cVar13 = "-CNVXZ"[lVar12 + 1];
        }
        local_2892[lVar12] = cVar13;
        lVar12 = lVar12 + 1;
        uVar10 = uVar10 - 1;
      } while (lVar12 != 5);
      local_288d = 0;
      uVar10 = 4;
      lVar12 = 0;
      do {
        if (((uVar7 >> 10 & 0x1f) >> (uVar10 & 0x1f) & 1) == 0) {
          cVar13 = '-';
        }
        else {
          cVar13 = "-CNVXZ"[lVar12 + 1];
        }
        local_2886[lVar12] = cVar13;
        lVar12 = lVar12 + 1;
        uVar10 = uVar10 - 1;
      } while (lVar12 != 5);
      local_2881 = 0;
      var_00 = &local_2868;
      local_2870 = info;
      fprintf((FILE *)syn68k_c_stream,
              "        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", \"%s\", \"%s\")\n",pcVar1,var_00,
              local_288c,local_2892,local_2886);
      fputs((char *)local_2868.next,(FILE *)syn68k_c_stream);
      lVar12 = 0;
      do {
        auStack_1438[lVar12] = 0;
        *(undefined1 *)((long)&local_2838.index + lVar12) = 0;
        lVar12 = lVar12 + 0x400;
      } while (lVar12 != 0x1400);
      transform_rtvad_aux(pLVar6,pLVar6,(char (*) [5] [1024])&local_2838);
      lVar12 = 0;
      bVar4 = true;
      do {
        bVar14 = bVar4;
        pCVar16 = local_2438 + lVar12 * 0x80;
        lVar8 = 0;
        do {
          if (*(char *)pCVar16 != '\0') {
            var_00 = pCVar16;
            fprintf((FILE *)syn68k_c_stream,"        %s%s;\n",
                    *(undefined8 *)(lVar12 * 0x28 + 0x118d48 + lVar8 * 8));
          }
          lVar8 = lVar8 + 1;
          pCVar16 = (CCVariant *)&pCVar16[0x19].native_code_info;
        } while (lVar8 != 4);
        lVar12 = 1;
        bVar4 = false;
      } while (bVar14);
      local_283c = FALSE;
      memset(&local_2838,0,0x200);
      pLVar6 = local_2878;
      gtd_aux(local_2878,(BOOL *)&local_2838,&local_283c);
      if (local_283c != FALSE) {
        fputs(";\n",(FILE *)syn68k_c_stream);
      }
      pPVar3 = local_2870;
      pPVar2 = local_2880;
      if ((pLVar6->token).type == TOK_LIST) {
        if (c_preamble[0] != '\0') {
          fprintf((FILE *)syn68k_c_stream,"        %s\n",c_preamble);
        }
        pFVar11 = syn68k_c_stream;
        fputs("        ",(FILE *)syn68k_c_stream);
        generate_code_for_list(pLVar6,(int)pFVar11,info_00,var_00);
        fputs(";\n",(FILE *)syn68k_c_stream);
        if (c_postamble[0] != '\0') {
          fprintf((FILE *)syn68k_c_stream,"        %s\n",c_postamble);
        }
        lVar12 = 4;
        pacVar17 = generate_c_code::cc_name;
        do {
          uVar7 = *(uint *)&pPVar2->name;
          if ((1 << ((byte)lVar12 & 0x1f) & uVar7 >> 0xf & 0x1e) != 0) {
            fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",pacVar17,
                    (ulong)(((uVar7 >> 0x14 & 0x1f) >> ((uint)lVar12 & 0x1f) & 1) != 0));
          }
          pacVar17 = pacVar17 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
        uVar7 = *(uint *)&pPVar2->name;
        if ((short)uVar7 < 0) {
          fprintf((FILE *)syn68k_c_stream,"        %s = %d;\n",0x112d10,
                  (ulong)((uVar7 >> 0x14 & 1) == 0));
        }
        if ((postcode != (char *)0x0) && (*postcode != '\0')) {
          fprintf((FILE *)syn68k_c_stream,"        %s\n");
        }
        iVar15 = synthetic_opcode_size(map);
        if (pPVar3->ends_block == FALSE) {
          fprintf((FILE *)syn68k_c_stream,"        CASE_POSTAMBLE (ROUND_UP (%d))\n",
                  (ulong)(uint)(iVar15 + pPVar3->operand_words_to_skip));
        }
        else {
          fputs("\n#ifdef PROFILE\n       profile_block (hash_lookup (READUL_US ((unsigned long)code - 4)));\n#endif\n"
                ,(FILE *)syn68k_c_stream);
          fwrite("#if SIZEOF_CHAR_P != 8\n\t    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n#else\n\t    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n#endif\n"
                 ,0xa2,1,(FILE *)syn68k_c_stream);
          fwrite("        CASE_POSTAMBLE (ROUND_UP (PTR_WORDS))\n",0x2e,1,(FILE *)syn68k_c_stream);
        }
      }
      else {
        parse_error(pLVar6,"Expecting code description list!\n");
      }
      return;
    }
  } while( true );
}

Assistant:

void
generate_c_code (const ParsedOpcodeInfo *info, const CCVariant *var,
		 int m68kop, int synop, SymbolTable *sym,
		 const char *operand_decls, const char *postcode,
		 const OpcodeMappingInfo *map)
{
  static const char cc_name[][16] = { "cpu_state.ccc", "cpu_state.ccn",
					"cpu_state.ccv", "cpu_state.ccx",
					"cpu_state.ccnz" };
  char buf1[6], buf2[6], buf3[6], buf4[17];
  int opcw;
  List *code = copy_list (var->code);
  int i;

  /* Clear out preamble and postamble. */
  c_preamble[0] = c_postamble[0] = '\0';

  /* Replace $ elements with appropriate things. */
  code = replace_dollar_elements (code, m68kop, info, var);

  /* Simplify the resulting code. */
  code = reduce (code, sym, 0);

  /* Output human-readable comment describing this synthetic opcode. */
  fprintf (syn68k_c_stream,
	   "\n      /* %s %s ms:%s mns:%s needs:%s */\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output case. */
  fprintf (syn68k_c_stream, "      CASE (0x%04X)\n", (unsigned) synop);
  fprintf (syn68k_c_stream, "        CASE_PREAMBLE (\"%s\", \"%s\", \"%s\", "
	   "\"%s\", \"%s\")\n",
	   info->name, opcode_bits_string (m68kop, info, var, buf4),
	   cc_bits_string (var->cc_may_set, buf1),
	   cc_bits_string (var->cc_may_not_set, buf2),
	   cc_bits_string (var->cc_needed, buf3));

  /* Output operand declarations. */
  fputs (operand_decls, syn68k_c_stream);

  /* Transform temp variables only used as one type to temp_variables,
   * and output decls for those variables.
   */
  transform_reg_to_var_and_decl (code);

  /* Output temp variable declarations. */
  generate_temp_decls (code);

  if (code->token.type != TOK_LIST)
    {
      parse_error (code, "Expecting code description list!\n");
      return;
    }

  /* Output preamble. */
  if (c_preamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_preamble);
  
  /* Generate the code they specified. */
  fputs ("        ", syn68k_c_stream);
  generate_code_for_list (code, m68kop, info, var);
  fputs (";\n", syn68k_c_stream);
  
  /* Output postamble. */
  if (c_postamble[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", c_postamble);
  
  /* Set any cc bits to 0 or 1 that are explicitly mentioned in the
   * cc variant description.  This saves the user some work generating
   * the 68k description file and reduces the chance of error.
   */
  for (i = 0; i < 4; i++)
    if ((var->cc_to_known_value >> (4 - i)) & 1)
      fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[i],
	       (var->cc_known_values >> (4 - i)) & 1);
  if (var->cc_to_known_value & 1)   /* Invert sense of Z bit. */
    fprintf (syn68k_c_stream, "        %s = %d;\n", cc_name[4],
	     !(var->cc_known_values & 1));

  if (postcode != NULL && postcode[0] != '\0')
    fprintf (syn68k_c_stream, "        %s\n", postcode);

  /* Count opcode words. */
  opcw = synthetic_opcode_size (map) + info->operand_words_to_skip;

  /* Only adjust code ptr if we didn't just end a block. */
  if (!info->ends_block)
    {
      /* Always increment enough so that the next opcode is guaranteed
       * to be a properly aligned pointer.
       */
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE (ROUND_UP (%d))\n",
	       (int) opcw);
    }

  else    /* If we end a block, profile the next block. */
    {
#if SIZEOF_CHAR_P != 8
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL (US_TO_SYN68K (code) - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#else
      fputs ("\n#ifdef PROFILE\n"
	     "       profile_block (hash_lookup "
	     "(READUL_US ((unsigned long)code - 4)));\n"
	     "#endif\n",
	     syn68k_c_stream);
#endif

#if defined (SYNCHRONOUS_INTERRUPTS) && !defined (GENERATE_NATIVE_CODE)
      fprintf (syn68k_c_stream,
"#if SIZEOF_CHAR_P != 8\n"
"	    CHECK_FOR_INTERRUPT (READUL (US_TO_SYN68K (code - PTR_WORDS)));\n"
"#else\n"
"	    CHECK_FOR_INTERRUPT (READUL_US (code - PTR_WORDS));\n"
"#endif\n");
#endif
      fprintf (syn68k_c_stream, "        CASE_POSTAMBLE "
	       "(ROUND_UP (PTR_WORDS))\n");
    }
  /* Done with this instruction. */
}